

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommaInitializer.h
# Opt level: O1

CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> * __thiscall
Eigen::CommaInitializer<Eigen::Matrix<double,3,3,0,3,3>>::operator_
          (CommaInitializer<Eigen::Matrix<double,3,3,0,3,3>> *this,
          DenseBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *other)

{
  undefined8 *puVar1;
  long lVar2;
  long lVar3;
  
  if (*(long *)(this + 0x10) == 3) {
    lVar2 = *(long *)(this + 8);
    lVar3 = *(long *)(this + 0x18);
    *(long *)(this + 8) = lVar2 + lVar3;
    *(undefined8 *)(this + 0x10) = 0;
    *(undefined8 *)(this + 0x18) = 1;
    if (2 < lVar2 + lVar3) {
      __assert_fail("m_row+m_currentBlockRows<=m_xpr.rows() && \"Too many rows passed to comma initializer (operator<<)\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CommaInitializer.h"
                    ,0x5d,
                    "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3>>::operator,(const DenseBase<OtherDerived> &) [MatrixType = Eigen::Matrix<double, 3, 3>, OtherDerived = Eigen::Matrix<double, 1, 3>]"
                   );
    }
  }
  if (0 < *(long *)(this + 0x10)) {
    __assert_fail("(m_col + other.cols() <= m_xpr.cols()) && \"Too many coefficients passed to comma initializer (operator<<)\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CommaInitializer.h"
                  ,0x60,
                  "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3>>::operator,(const DenseBase<OtherDerived> &) [MatrixType = Eigen::Matrix<double, 3, 3>, OtherDerived = Eigen::Matrix<double, 1, 3>]"
                 );
  }
  if (*(long *)(this + 0x18) != 1) {
    __assert_fail("m_currentBlockRows==other.rows()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CommaInitializer.h"
                  ,0x61,
                  "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3>>::operator,(const DenseBase<OtherDerived> &) [MatrixType = Eigen::Matrix<double, 3, 3>, OtherDerived = Eigen::Matrix<double, 1, 3>]"
                 );
  }
  lVar2 = *(long *)(this + 8);
  if (((-1 < lVar2) && (*(long *)(this + 0x10) == 0)) && (lVar2 < 3)) {
    puVar1 = (undefined8 *)(*(long *)this + lVar2 * 8);
    *puVar1 = *(undefined8 *)other;
    puVar1[3] = *(undefined8 *)(other + 8);
    puVar1[6] = *(undefined8 *)(other + 0x10);
    *(undefined8 *)(this + 0x10) = 3;
    return (CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this;
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Block.h"
                ,0x93,
                "Eigen::Block<Eigen::Matrix<double, 3, 3>, 1, 3>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, 3, 3>, BlockRows = 1, BlockCols = 3, InnerPanel = false]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC
  CommaInitializer& operator,(const DenseBase<OtherDerived>& other)
  {
    if (m_col==m_xpr.cols() && (other.cols()!=0 || other.rows()!=m_currentBlockRows))
    {
      m_row+=m_currentBlockRows;
      m_col = 0;
      m_currentBlockRows = other.rows();
      eigen_assert(m_row+m_currentBlockRows<=m_xpr.rows()
        && "Too many rows passed to comma initializer (operator<<)");
    }
    eigen_assert((m_col + other.cols() <= m_xpr.cols())
      && "Too many coefficients passed to comma initializer (operator<<)");
    eigen_assert(m_currentBlockRows==other.rows());
    m_xpr.template block<OtherDerived::RowsAtCompileTime, OtherDerived::ColsAtCompileTime>
                    (m_row, m_col, other.rows(), other.cols()) = other;
    m_col += other.cols();
    return *this;
  }